

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O2

void __thiscall
JetHead::list<Timer::TimerNode>::push_back(list<Timer::TimerNode> *this,TimerNode *val)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *this_00;
  
  this_00 = (Node *)operator_new(0x38,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                 ,0xa7);
  (this_00->val).mEvent.mObj = (Event *)0x0;
  Timer::TimerNode::operator=((TimerNode *)this_00,val);
  pNVar1 = this->mTail;
  pNVar2 = pNVar1->prev;
  this_00->prev = pNVar2;
  this_00->next = pNVar1;
  pNVar2->next = this_00;
  pNVar1->prev = this_00;
  return;
}

Assistant:

void push_back(const T& val)
		{
			Node* newTail = jh_new Node;
			newTail->val = val;
			newTail->prev = mTail->prev;
			newTail->next = mTail;

			mTail->prev->next = newTail;
			mTail->prev = newTail;
		}